

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

void __thiscall
cmGraphVizWriter::ReadSettings
          (cmGraphVizWriter *this,string *settingsFileName,string *fallbackSettingsFileName)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  ulong uVar4;
  string_view sVar5;
  undefined1 local_1d18 [8];
  RegularExpression currentRegex;
  string *currentRegexString;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_1c18 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreTargetsRegExVector;
  string local_1bf8;
  cmValue local_1bd8;
  cmValue value_14;
  string ignoreTargetsRegexes;
  allocator<char> local_1b99;
  string local_1b98;
  cmValue local_1b78;
  cmValue value_13;
  allocator<char> local_1b59;
  string local_1b58;
  cmValue local_1b38;
  cmValue value_12;
  allocator<char> local_1b19;
  string local_1b18;
  cmValue local_1af8;
  cmValue value_11;
  allocator<char> local_1ad9;
  string local_1ad8;
  cmValue local_1ab8;
  cmValue value_10;
  allocator<char> local_1a99;
  string local_1a98;
  cmValue local_1a78;
  cmValue value_9;
  allocator<char> local_1a59;
  string local_1a58;
  cmValue local_1a38;
  cmValue value_8;
  allocator<char> local_1a19;
  string local_1a18;
  cmValue local_19f8;
  cmValue value_7;
  allocator<char> local_19d9;
  string local_19d8;
  cmValue local_19b8;
  cmValue value_6;
  allocator<char> local_1999;
  string local_1998;
  cmValue local_1978;
  cmValue value_5;
  allocator<char> local_1959;
  string local_1958;
  cmValue local_1938;
  cmValue value_4;
  allocator<char> local_1919;
  string local_1918;
  cmValue local_18f8;
  cmValue value_3;
  string local_18e8;
  cmValue local_18c8;
  cmValue value_2;
  string local_18b8;
  cmValue local_1898;
  cmValue value_1;
  string local_1888;
  cmValue local_1868;
  cmValue value;
  undefined1 local_1838 [8];
  string inFileName;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> lg;
  undefined1 local_17f8 [8];
  cmMakefile mf;
  cmGlobalGenerator ggi;
  allocator<char> local_8f1;
  string local_8f0;
  allocator<char> local_8b9;
  string local_8b8;
  undefined1 local_898 [8];
  cmake cm;
  string *fallbackSettingsFileName_local;
  string *settingsFileName_local;
  cmGraphVizWriter *this_local;
  
  cm.ProfilingOutput._M_t.
  super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>._M_t
  .super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>.
  super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>,_true,_true>
        )(__uniq_ptr_data<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>,_true,_true>
          )fallbackSettingsFileName;
  cmake::cmake((cmake *)local_898,RoleScript,Unknown,Normal);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8b8,"",&local_8b9);
  cmake::SetHomeDirectory((cmake *)local_898,&local_8b8);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::allocator<char>::~allocator(&local_8b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8f0,"",&local_8f1);
  cmake::SetHomeOutputDirectory((cmake *)local_898,&local_8f0);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::allocator<char>::~allocator(&local_8f1);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)&ggi.InstallTargetEnabled,(cmake *)local_898);
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&ggi.InstallTargetEnabled);
  cmGlobalGenerator::cmGlobalGenerator
            ((cmGlobalGenerator *)&mf.IsSourceFileTryCompile,(cmake *)local_898);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)&lg,(cmake *)local_898);
  cmMakefile::cmMakefile
            ((cmMakefile *)local_17f8,(cmGlobalGenerator *)&mf.IsSourceFileTryCompile,
             (cmStateSnapshot *)&lg);
  cmGlobalGenerator::CreateLocalGenerator
            ((cmGlobalGenerator *)((long)&inFileName.field_2 + 8),
             (cmMakefile *)&mf.IsSourceFileTryCompile);
  std::__cxx11::string::string((string *)local_1838,(string *)settingsFileName);
  bVar1 = cmsys::SystemTools::FileExists((string *)local_1838);
  if (!bVar1) {
    std::__cxx11::string::operator=
              ((string *)local_1838,
               (string *)
               cm.ProfilingOutput._M_t.
               super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>
               .super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl);
    bVar1 = cmsys::SystemTools::FileExists((string *)local_1838);
    if (!bVar1) goto LAB_00887599;
  }
  bVar1 = cmMakefile::ReadListFile((cmMakefile *)local_17f8,(string *)local_1838);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Reading GraphViz options file: ");
    poVar2 = std::operator<<(poVar2,(string *)local_1838);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1888,"GRAPHVIZ_GRAPH_NAME",
               (allocator<char> *)((long)&value_1.Value + 7));
    local_1868 = cmMakefile::GetDefinition((cmMakefile *)local_17f8,&local_1888);
    std::__cxx11::string::~string((string *)&local_1888);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_1.Value + 7));
    bVar1 = cmValue::operator_cast_to_bool(&local_1868);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_1868);
      std::__cxx11::string::operator=((string *)&this->GraphName,(string *)psVar3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_18b8,"GRAPHVIZ_GRAPH_HEADER",
               (allocator<char> *)((long)&value_2.Value + 7));
    local_1898 = cmMakefile::GetDefinition((cmMakefile *)local_17f8,&local_18b8);
    std::__cxx11::string::~string((string *)&local_18b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_2.Value + 7));
    bVar1 = cmValue::operator_cast_to_bool(&local_1898);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_1898);
      std::__cxx11::string::operator=((string *)&this->GraphHeader,(string *)psVar3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_18e8,"GRAPHVIZ_NODE_PREFIX",
               (allocator<char> *)((long)&value_3.Value + 7));
    local_18c8 = cmMakefile::GetDefinition((cmMakefile *)local_17f8,&local_18e8);
    std::__cxx11::string::~string((string *)&local_18e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_3.Value + 7));
    bVar1 = cmValue::operator_cast_to_bool(&local_18c8);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_18c8);
      std::__cxx11::string::operator=((string *)&this->GraphNodePrefix,(string *)psVar3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1918,"GRAPHVIZ_EXECUTABLES",&local_1919);
    local_18f8 = cmMakefile::GetDefinition((cmMakefile *)local_17f8,&local_1918);
    std::__cxx11::string::~string((string *)&local_1918);
    std::allocator<char>::~allocator(&local_1919);
    bVar1 = cmValue::operator_cast_to_bool(&local_18f8);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_18f8);
      sVar5 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
      value_4.Value = (string *)sVar5._M_len;
      bVar1 = cmIsOn(sVar5);
      this->GenerateForExecutables = bVar1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1958,"GRAPHVIZ_STATIC_LIBS",&local_1959);
    local_1938 = cmMakefile::GetDefinition((cmMakefile *)local_17f8,&local_1958);
    std::__cxx11::string::~string((string *)&local_1958);
    std::allocator<char>::~allocator(&local_1959);
    bVar1 = cmValue::operator_cast_to_bool(&local_1938);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_1938);
      sVar5 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
      value_5.Value = (string *)sVar5._M_len;
      bVar1 = cmIsOn(sVar5);
      this->GenerateForStaticLibs = bVar1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1998,"GRAPHVIZ_SHARED_LIBS",&local_1999);
    local_1978 = cmMakefile::GetDefinition((cmMakefile *)local_17f8,&local_1998);
    std::__cxx11::string::~string((string *)&local_1998);
    std::allocator<char>::~allocator(&local_1999);
    bVar1 = cmValue::operator_cast_to_bool(&local_1978);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_1978);
      sVar5 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
      value_6.Value = (string *)sVar5._M_len;
      bVar1 = cmIsOn(sVar5);
      this->GenerateForSharedLibs = bVar1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_19d8,"GRAPHVIZ_MODULE_LIBS",&local_19d9);
    local_19b8 = cmMakefile::GetDefinition((cmMakefile *)local_17f8,&local_19d8);
    std::__cxx11::string::~string((string *)&local_19d8);
    std::allocator<char>::~allocator(&local_19d9);
    bVar1 = cmValue::operator_cast_to_bool(&local_19b8);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_19b8);
      sVar5 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
      value_7.Value = (string *)sVar5._M_len;
      bVar1 = cmIsOn(sVar5);
      this->GenerateForModuleLibs = bVar1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a18,"GRAPHVIZ_INTERFACE_LIBS",&local_1a19);
    local_19f8 = cmMakefile::GetDefinition((cmMakefile *)local_17f8,&local_1a18);
    std::__cxx11::string::~string((string *)&local_1a18);
    std::allocator<char>::~allocator(&local_1a19);
    bVar1 = cmValue::operator_cast_to_bool(&local_19f8);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_19f8);
      sVar5 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
      value_8.Value = (string *)sVar5._M_len;
      bVar1 = cmIsOn(sVar5);
      this->GenerateForInterfaceLibs = bVar1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a58,"GRAPHVIZ_OBJECT_LIBS",&local_1a59);
    local_1a38 = cmMakefile::GetDefinition((cmMakefile *)local_17f8,&local_1a58);
    std::__cxx11::string::~string((string *)&local_1a58);
    std::allocator<char>::~allocator(&local_1a59);
    bVar1 = cmValue::operator_cast_to_bool(&local_1a38);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_1a38);
      sVar5 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
      value_9.Value = (string *)sVar5._M_len;
      bVar1 = cmIsOn(sVar5);
      this->GenerateForObjectLibs = bVar1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a98,"GRAPHVIZ_UNKNOWN_LIBS",&local_1a99);
    local_1a78 = cmMakefile::GetDefinition((cmMakefile *)local_17f8,&local_1a98);
    std::__cxx11::string::~string((string *)&local_1a98);
    std::allocator<char>::~allocator(&local_1a99);
    bVar1 = cmValue::operator_cast_to_bool(&local_1a78);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_1a78);
      sVar5 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
      value_10.Value = (string *)sVar5._M_len;
      bVar1 = cmIsOn(sVar5);
      this->GenerateForUnknownLibs = bVar1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1ad8,"GRAPHVIZ_CUSTOM_TARGETS",&local_1ad9);
    local_1ab8 = cmMakefile::GetDefinition((cmMakefile *)local_17f8,&local_1ad8);
    std::__cxx11::string::~string((string *)&local_1ad8);
    std::allocator<char>::~allocator(&local_1ad9);
    bVar1 = cmValue::operator_cast_to_bool(&local_1ab8);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_1ab8);
      sVar5 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
      value_11.Value = (string *)sVar5._M_len;
      bVar1 = cmIsOn(sVar5);
      this->GenerateForCustomTargets = bVar1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b18,"GRAPHVIZ_EXTERNAL_LIBS",&local_1b19);
    local_1af8 = cmMakefile::GetDefinition((cmMakefile *)local_17f8,&local_1b18);
    std::__cxx11::string::~string((string *)&local_1b18);
    std::allocator<char>::~allocator(&local_1b19);
    bVar1 = cmValue::operator_cast_to_bool(&local_1af8);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_1af8);
      sVar5 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
      value_12.Value = (string *)sVar5._M_len;
      bVar1 = cmIsOn(sVar5);
      this->GenerateForExternals = bVar1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b58,"GRAPHVIZ_GENERATE_PER_TARGET",&local_1b59);
    local_1b38 = cmMakefile::GetDefinition((cmMakefile *)local_17f8,&local_1b58);
    std::__cxx11::string::~string((string *)&local_1b58);
    std::allocator<char>::~allocator(&local_1b59);
    bVar1 = cmValue::operator_cast_to_bool(&local_1b38);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_1b38);
      sVar5 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
      value_13.Value = (string *)sVar5._M_len;
      bVar1 = cmIsOn(sVar5);
      this->GeneratePerTarget = bVar1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b98,"GRAPHVIZ_GENERATE_DEPENDERS",&local_1b99);
    local_1b78 = cmMakefile::GetDefinition((cmMakefile *)local_17f8,&local_1b98);
    std::__cxx11::string::~string((string *)&local_1b98);
    std::allocator<char>::~allocator(&local_1b99);
    bVar1 = cmValue::operator_cast_to_bool(&local_1b78);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_1b78);
      sVar5 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
      bVar1 = cmIsOn(sVar5);
      this->GenerateDependers = bVar1;
    }
    std::__cxx11::string::string((string *)&value_14);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1bf8,"GRAPHVIZ_IGNORE_TARGETS",
               (allocator<char> *)
               ((long)&ignoreTargetsRegExVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_1bd8 = cmMakefile::GetDefinition((cmMakefile *)local_17f8,&local_1bf8);
    std::__cxx11::string::~string((string *)&local_1bf8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&ignoreTargetsRegExVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    bVar1 = cmValue::operator_cast_to_bool(&local_1bd8);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_1bd8);
      std::__cxx11::string::operator=((string *)&value_14,(string *)psVar3);
    }
    std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
              (&this->TargetsToIgnoreRegex);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      sVar5 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&value_14);
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1c18,sVar5,false);
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1c18);
      currentRegexString =
           (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1c18);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&currentRegexString), bVar1) {
        currentRegex._200_8_ =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
        cmsys::RegularExpression::RegularExpression((RegularExpression *)local_1d18);
        bVar1 = cmsys::RegularExpression::compile
                          ((RegularExpression *)local_1d18,(string *)currentRegex._200_8_);
        if (!bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"Could not compile bad regex \"");
          poVar2 = std::operator<<(poVar2,(string *)currentRegex._200_8_);
          poVar2 = std::operator<<(poVar2,"\"");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::push_back
                  (&this->TargetsToIgnoreRegex,(value_type *)local_1d18);
        cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_1d18);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1c18);
    }
    std::__cxx11::string::~string((string *)&value_14);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                   "Problem opening GraphViz options file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1838);
    cmSystemTools::Error((string *)&value);
    std::__cxx11::string::~string((string *)&value);
  }
LAB_00887599:
  std::__cxx11::string::~string((string *)local_1838);
  std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::~unique_ptr
            ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
             ((long)&inFileName.field_2 + 8));
  cmMakefile::~cmMakefile((cmMakefile *)local_17f8);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&mf.IsSourceFileTryCompile);
  cmake::~cmake((cmake *)local_898);
  return;
}

Assistant:

void cmGraphVizWriter::ReadSettings(
  const std::string& settingsFileName,
  const std::string& fallbackSettingsFileName)
{
  cmake cm(cmake::RoleScript, cmState::Unknown);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator ggi(&cm);
  cmMakefile mf(&ggi, cm.GetCurrentSnapshot());
  std::unique_ptr<cmLocalGenerator> lg(ggi.CreateLocalGenerator(&mf));

  std::string inFileName = settingsFileName;
  if (!cmSystemTools::FileExists(inFileName)) {
    inFileName = fallbackSettingsFileName;
    if (!cmSystemTools::FileExists(inFileName)) {
      return;
    }
  }

  if (!mf.ReadListFile(inFileName)) {
    cmSystemTools::Error("Problem opening GraphViz options file: " +
                         inFileName);
    return;
  }

  std::cout << "Reading GraphViz options file: " << inFileName << std::endl;

#define set_if_set(var, cmakeDefinition)                                      \
  do {                                                                        \
    cmValue value = mf.GetDefinition(cmakeDefinition);                        \
    if (value) {                                                              \
      (var) = *value;                                                         \
    }                                                                         \
  } while (false)

  set_if_set(this->GraphName, "GRAPHVIZ_GRAPH_NAME");
  set_if_set(this->GraphHeader, "GRAPHVIZ_GRAPH_HEADER");
  set_if_set(this->GraphNodePrefix, "GRAPHVIZ_NODE_PREFIX");

#define set_bool_if_set(var, cmakeDefinition)                                 \
  do {                                                                        \
    cmValue value = mf.GetDefinition(cmakeDefinition);                        \
    if (value) {                                                              \
      (var) = cmIsOn(*value);                                                 \
    }                                                                         \
  } while (false)

  set_bool_if_set(this->GenerateForExecutables, "GRAPHVIZ_EXECUTABLES");
  set_bool_if_set(this->GenerateForStaticLibs, "GRAPHVIZ_STATIC_LIBS");
  set_bool_if_set(this->GenerateForSharedLibs, "GRAPHVIZ_SHARED_LIBS");
  set_bool_if_set(this->GenerateForModuleLibs, "GRAPHVIZ_MODULE_LIBS");
  set_bool_if_set(this->GenerateForInterfaceLibs, "GRAPHVIZ_INTERFACE_LIBS");
  set_bool_if_set(this->GenerateForObjectLibs, "GRAPHVIZ_OBJECT_LIBS");
  set_bool_if_set(this->GenerateForUnknownLibs, "GRAPHVIZ_UNKNOWN_LIBS");
  set_bool_if_set(this->GenerateForCustomTargets, "GRAPHVIZ_CUSTOM_TARGETS");
  set_bool_if_set(this->GenerateForExternals, "GRAPHVIZ_EXTERNAL_LIBS");
  set_bool_if_set(this->GeneratePerTarget, "GRAPHVIZ_GENERATE_PER_TARGET");
  set_bool_if_set(this->GenerateDependers, "GRAPHVIZ_GENERATE_DEPENDERS");

  std::string ignoreTargetsRegexes;
  set_if_set(ignoreTargetsRegexes, "GRAPHVIZ_IGNORE_TARGETS");

  this->TargetsToIgnoreRegex.clear();
  if (!ignoreTargetsRegexes.empty()) {
    std::vector<std::string> ignoreTargetsRegExVector =
      cmExpandedList(ignoreTargetsRegexes);
    for (std::string const& currentRegexString : ignoreTargetsRegExVector) {
      cmsys::RegularExpression currentRegex;
      if (!currentRegex.compile(currentRegexString)) {
        std::cerr << "Could not compile bad regex \"" << currentRegexString
                  << "\"" << std::endl;
      }
      this->TargetsToIgnoreRegex.push_back(std::move(currentRegex));
    }
  }
}